

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

size_t __thiscall
Js::FunctionBody::GetLoopBodyName
          (FunctionBody *this,uint loopNumber,WCHAR *displayName,size_t sizeInChars)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  char16 *string;
  size_t sVar4;
  undefined4 *puVar5;
  int charsWritten;
  size_t length;
  char16 *functionName;
  size_t sizeInChars_local;
  WCHAR *displayName_local;
  uint loopNumber_local;
  FunctionBody *this_local;
  
  string = ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
  sVar4 = PAL_wcslen(string);
  this_local = (FunctionBody *)(sVar4 + 0x10);
  if ((this_local <= sizeInChars) && (displayName != (WCHAR *)0x0)) {
    iVar3 = swprintf_s((char16_t_conflict *)displayName,(size_t)this_local,
                       (char16_t_conflict *)L"%s%s%u",string,LoopWStr,(ulong)(loopNumber + 1));
    if (iVar3 == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x25a4,"(charsWritten != -1)","charsWritten != -1");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local = (FunctionBody *)(long)(iVar3 + 1);
  }
  return (size_t)this_local;
}

Assistant:

size_t FunctionBody::GetLoopBodyName(uint loopNumber, _Out_writes_opt_z_(sizeInChars) WCHAR* displayName, _In_ size_t sizeInChars)
    {
        const char16* functionName = this->GetExternalDisplayName();
        size_t length = wcslen(functionName) + /*length of largest int32*/ 10 + _countof(LoopWStr) + /*null*/ 1;
        if (sizeInChars < length || displayName == nullptr)
        {
            return length;
        }
        int charsWritten = swprintf_s(displayName, length, _u("%s%s%u"), functionName, LoopWStr, loopNumber + 1);
        Assert(charsWritten != -1);
        return charsWritten + /*nullptr*/ 1;
    }